

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellCommand.cpp
# Opt level: O0

void __thiscall
llbuild::buildsystem::ShellCommand::start(ShellCommand *this,BuildSystem *system,TaskInterface ti)

{
  TaskInterface ti_00;
  ShellCommandHandler *pSVar1;
  unique_ptr<llbuild::buildsystem::HandlerState,_std::default_delete<llbuild::buildsystem::HandlerState>_>
  local_30;
  BuildSystem *local_28;
  BuildSystem *system_local;
  ShellCommand *this_local;
  TaskInterface ti_local;
  
  ti_local.impl = ti.ctx;
  this_local = (ShellCommand *)ti.impl;
  local_28 = system;
  system_local = (BuildSystem *)this;
  pSVar1 = BuildSystem::resolveShellCommandHandler(system,this);
  this->handler = pSVar1;
  if (this->handler != (ShellCommandHandler *)0x0) {
    (*this->handler->_vptr_ShellCommandHandler[2])(&local_30,this->handler,this_local,ti_local.impl)
    ;
    std::
    unique_ptr<llbuild::buildsystem::HandlerState,_std::default_delete<llbuild::buildsystem::HandlerState>_>
    ::operator=(&this->handlerState,&local_30);
    std::
    unique_ptr<llbuild::buildsystem::HandlerState,_std::default_delete<llbuild::buildsystem::HandlerState>_>
    ::~unique_ptr(&local_30);
  }
  ti_00.ctx = ti_local.impl;
  ti_00.impl = this_local;
  ExternalCommand::start(&this->super_ExternalCommand,local_28,ti_00);
  return;
}

Assistant:

void ShellCommand::start(BuildSystem& system, TaskInterface ti) {
  // Resolve the plugin state.
  handler = system.resolveShellCommandHandler(this);

  // Delegate to handler, if used.
  if (handler) {
    handlerState = handler->start(ti, this);
  }

  this->ExternalCommand::start(system, ti);
}